

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void __thiscall
duckdb::CreateSortKeyHelpers::DecodeSortKey
          (CreateSortKeyHelpers *this,string_t sort_key,Vector *result,idx_t result_idx,
          OrderModifiers modifiers)

{
  DecodeSortKeyVectorData sort_key_data;
  DecodeSortKeyData decode_data;
  DecodeSortKeyVectorData local_80;
  undefined8 local_58;
  const_data_ptr_t local_50;
  DecodeSortKeyData local_48;
  
  local_58 = this;
  local_50 = sort_key.value._0_8_;
  DecodeSortKeyVectorData::DecodeSortKeyVectorData
            (&local_80,&(sort_key.value._8_8_)->type,SUB82(result_idx,0));
  local_48.data = sort_key.value._0_8_;
  if ((uint)this < 0xd) {
    local_48.data = (const_data_ptr_t)((long)&local_58 + 4);
  }
  local_48.size = (ulong)this & 0xffffffff;
  local_48.position = 0;
  DecodeSortKeyRecursive(&local_48,&local_80,sort_key.value._8_8_,(idx_t)result);
  ::std::vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>::
  ~vector(&local_80.child_data.
           super_vector<duckdb::DecodeSortKeyVectorData,_std::allocator<duckdb::DecodeSortKeyVectorData>_>
         );
  return;
}

Assistant:

void CreateSortKeyHelpers::DecodeSortKey(string_t sort_key, Vector &result, idx_t result_idx,
                                         OrderModifiers modifiers) {
	DecodeSortKeyVectorData sort_key_data(result.GetType(), modifiers);
	DecodeSortKeyData decode_data(sort_key);
	DecodeSortKeyRecursive(decode_data, sort_key_data, result, result_idx);
}